

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O2

void __thiscall tst_RoleMaskProxyModel::testMoveRowAfter(tst_RoleMaskProxyModel *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ModelTest *this_00;
  uint uVar4;
  anon_union_24_3_e3d07ef4_for_data local_c0;
  anon_union_24_3_e3d07ef4_for_data local_a0;
  QPersistentModelIndex proxyParentIdx;
  QModelIndex local_80;
  RoleMaskProxyModel proxyModel;
  int iStack_64;
  QPersistentModelIndex parentIdx;
  GenericModel baseModel;
  
  GenericModel::GenericModel(&baseModel,(QObject *)0x0);
  local_c0._forAlignment = -NAN;
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  GenericModel::insertColumns((int)&baseModel,0,(QModelIndex *)0x2);
  iVar3 = (int)&local_c0;
  local_c0._forAlignment = -NAN;
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  GenericModel::insertRows((int)&baseModel,0,(QModelIndex *)0x5);
  local_c0._forAlignment = -NAN;
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  testMoveRowAfter::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&baseModel,(QAbstractItemModel *)local_c0.data,
             (QModelIndex *)0x0,iVar3);
  _proxyModel = -1;
  iStack_64 = -1;
  GenericModel::index((int)&local_c0,(int)&baseModel,(QModelIndex *)0x1);
  QPersistentModelIndex::QPersistentModelIndex(&parentIdx,(QModelIndex *)&local_c0);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_c0,&parentIdx);
  GenericModel::insertColumns((int)&baseModel,0,(QModelIndex *)0x2);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_c0,&parentIdx);
  iVar3 = (int)&local_c0;
  GenericModel::insertRows((int)&baseModel,0,(QModelIndex *)0x5);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_c0,&parentIdx);
  testMoveRowAfter::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&baseModel,(QAbstractItemModel *)local_c0.data,
             (QModelIndex *)0x32,iVar3);
  RoleMaskProxyModel::RoleMaskProxyModel(&proxyModel,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyModel,(QObject *)&baseModel);
  RoleMaskProxyModel::addMaskedRole((int)&proxyModel);
  RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_a0,&parentIdx);
  QIdentityProxyModel::mapFromSource((QModelIndex *)&local_c0);
  QPersistentModelIndex::QPersistentModelIndex(&proxyParentIdx,(QModelIndex *)&local_c0);
  uVar4 = 0;
  do {
    local_c0._forAlignment = -NAN;
    local_c0._8_8_ = 0;
    local_c0._16_8_ = 0;
    iVar3 = QIdentityProxyModel::rowCount((QModelIndex *)&proxyModel);
    if (iVar3 <= (int)uVar4) {
      uVar4 = 0;
      goto LAB_0010af79;
    }
    local_80.r = -1;
    local_80.c = -1;
    local_80.i = 0;
    local_80.m = (QAbstractItemModel *)0x0;
    QIdentityProxyModel::index
              ((int)&local_a0,(int)(QModelIndex *)&proxyModel,(QModelIndex *)(ulong)uVar4);
    QVariant::QVariant((QVariant *)&local_c0,uVar4 + 1000);
    bVar1 = (bool)RoleMaskProxyModel::setData
                            ((QModelIndex *)&proxyModel,(QVariant *)&local_a0,(int)&local_c0);
    cVar2 = QTest::qVerify(bVar1,
                           "proxyModel.setData(proxyModel.index(i, 0), 1000 + i, Qt::UserRole)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0xba);
    QVariant::~QVariant((QVariant *)&local_c0);
    uVar4 = uVar4 + 1;
  } while (cVar2 != '\0');
  goto LAB_0010c12a;
  while( true ) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&proxyParentIdx);
    QIdentityProxyModel::index
              ((int)&local_a0,(int)(QModelIndex *)&proxyModel,(QModelIndex *)(ulong)uVar4);
    QVariant::QVariant((QVariant *)&local_c0,uVar4 + 2000);
    bVar1 = (bool)RoleMaskProxyModel::setData
                            ((QModelIndex *)&proxyModel,(QVariant *)&local_a0,(int)&local_c0);
    cVar2 = QTest::qVerify(bVar1,
                           "proxyModel.setData(proxyModel.index(i, 0, proxyParentIdx), 2000 + i, Qt::UserRole)"
                           ,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0xbc);
    QVariant::~QVariant((QVariant *)&local_c0);
    uVar4 = uVar4 + 1;
    if (cVar2 == '\0') break;
LAB_0010af79:
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_c0,&proxyParentIdx);
    iVar3 = QIdentityProxyModel::rowCount((QModelIndex *)&proxyModel);
    if (iVar3 <= (int)uVar4) {
      local_c0._forAlignment = -NAN;
      local_c0._8_8_ = 0;
      local_c0._16_8_ = 0;
      local_a0._forAlignment = -NAN;
      local_a0._8_8_ = 0;
      local_a0._16_8_ = 0;
      bVar1 = (bool)GenericModel::moveRows
                              ((QModelIndex *)&baseModel,(int)&local_c0,0,(QModelIndex *)0x1,
                               (int)&local_a0);
      cVar2 = QTest::qVerify(bVar1,"baseModel.moveRows(QModelIndex(), 0, 1, QModelIndex(), 5)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0xbd);
      if (cVar2 != '\0') {
        local_80.r = -1;
        local_80.c = -1;
        local_80.i = 0;
        local_80.m = (QAbstractItemModel *)0x0;
        QIdentityProxyModel::index((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x0);
        QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
        iVar3 = QVariant::toInt((bool *)local_c0.data);
        cVar2 = QTest::qCompare(iVar3,0x3e9,"proxyModel.index(0, 0).data(Qt::UserRole).toInt()",
                                "1001",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                ,0xbe);
        QVariant::~QVariant((QVariant *)&local_c0);
        if (cVar2 != '\0') {
          local_80.r = -1;
          local_80.c = -1;
          local_80.i = 0;
          local_80.m = (QAbstractItemModel *)0x0;
          QIdentityProxyModel::index((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x1);
          QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
          iVar3 = QVariant::toInt((bool *)local_c0.data);
          cVar2 = QTest::qCompare(iVar3,0x3ea,"proxyModel.index(1, 0).data(Qt::UserRole).toInt()",
                                  "1002",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                  ,0xbf);
          QVariant::~QVariant((QVariant *)&local_c0);
          if (cVar2 != '\0') {
            local_80.r = -1;
            local_80.c = -1;
            local_80.i = 0;
            local_80.m = (QAbstractItemModel *)0x0;
            QIdentityProxyModel::index((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x2);
            QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
            iVar3 = QVariant::toInt((bool *)local_c0.data);
            cVar2 = QTest::qCompare(iVar3,0x3eb,"proxyModel.index(2, 0).data(Qt::UserRole).toInt()",
                                    "1003",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                    ,0xc0);
            QVariant::~QVariant((QVariant *)&local_c0);
            if (cVar2 != '\0') {
              local_80.r = -1;
              local_80.c = -1;
              local_80.i = 0;
              local_80.m = (QAbstractItemModel *)0x0;
              QIdentityProxyModel::index((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x3);
              QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
              iVar3 = QVariant::toInt((bool *)local_c0.data);
              cVar2 = QTest::qCompare(iVar3,0x3ec,
                                      "proxyModel.index(3, 0).data(Qt::UserRole).toInt()","1004",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                      ,0xc1);
              QVariant::~QVariant((QVariant *)&local_c0);
              if (cVar2 != '\0') {
                local_80.r = -1;
                local_80.c = -1;
                local_80.i = 0;
                local_80.m = (QAbstractItemModel *)0x0;
                QIdentityProxyModel::index((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x4);
                QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
                iVar3 = QVariant::toInt((bool *)local_c0.data);
                cVar2 = QTest::qCompare(iVar3,1000,
                                        "proxyModel.index(4, 0).data(Qt::UserRole).toInt()","1000",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                        ,0xc2);
                QVariant::~QVariant((QVariant *)&local_c0);
                if (cVar2 != '\0') {
                  QPersistentModelIndex::data((int)&local_c0);
                  iVar3 = QVariant::toInt((bool *)local_c0.data);
                  cVar2 = QTest::qCompare(iVar3,0x3e9,"proxyParentIdx.data(Qt::UserRole).toInt()",
                                          "1001",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                          ,0xc3);
                  QVariant::~QVariant((QVariant *)&local_c0);
                  if (cVar2 != '\0') {
                    QPersistentModelIndex::operator_cast_to_QModelIndex
                              ((QModelIndex *)&local_c0,&parentIdx);
                    QPersistentModelIndex::operator_cast_to_QModelIndex
                              ((QModelIndex *)&local_a0,&parentIdx);
                    bVar1 = (bool)GenericModel::moveRows
                                            ((QModelIndex *)&baseModel,(int)&local_c0,0,
                                             (QModelIndex *)0x1,(int)&local_a0);
                    cVar2 = QTest::qVerify(bVar1,"baseModel.moveRows(parentIdx, 0, 1, parentIdx, 5)"
                                           ,"",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                           ,0xc4);
                    if (cVar2 != '\0') {
                      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&proxyParentIdx)
                      ;
                      QIdentityProxyModel::index((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x0)
                      ;
                      QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
                      iVar3 = QVariant::toInt((bool *)local_c0.data);
                      cVar2 = QTest::qCompare(iVar3,0x7d1,
                                              "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                              ,"2001",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                              ,0xc5);
                      QVariant::~QVariant((QVariant *)&local_c0);
                      if (cVar2 != '\0') {
                        QPersistentModelIndex::operator_cast_to_QModelIndex
                                  (&local_80,&proxyParentIdx);
                        QIdentityProxyModel::index
                                  ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x1);
                        QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
                        iVar3 = QVariant::toInt((bool *)local_c0.data);
                        cVar2 = QTest::qCompare(iVar3,0x7d2,
                                                "proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                ,"2002",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                ,0xc6);
                        QVariant::~QVariant((QVariant *)&local_c0);
                        if (cVar2 != '\0') {
                          QPersistentModelIndex::operator_cast_to_QModelIndex
                                    (&local_80,&proxyParentIdx);
                          QIdentityProxyModel::index
                                    ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x2);
                          QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
                          iVar3 = QVariant::toInt((bool *)local_c0.data);
                          cVar2 = QTest::qCompare(iVar3,0x7d3,
                                                  "proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,199);
                          QVariant::~QVariant((QVariant *)&local_c0);
                          if (cVar2 != '\0') {
                            QPersistentModelIndex::operator_cast_to_QModelIndex
                                      (&local_80,&proxyParentIdx);
                            QIdentityProxyModel::index
                                      ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x3);
                            QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
                            iVar3 = QVariant::toInt((bool *)local_c0.data);
                            cVar2 = QTest::qCompare(iVar3,0x7d4,
                                                                                                        
                                                  "proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,200);
                            QVariant::~QVariant((QVariant *)&local_c0);
                            if (cVar2 != '\0') {
                              QPersistentModelIndex::operator_cast_to_QModelIndex
                                        (&local_80,&proxyParentIdx);
                              QIdentityProxyModel::index
                                        ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x4);
                              QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100
                                               );
                              iVar3 = QVariant::toInt((bool *)local_c0.data);
                              cVar2 = QTest::qCompare(iVar3,2000,
                                                                                                            
                                                  "proxyModel.index(4, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xc9);
                              QVariant::~QVariant((QVariant *)&local_c0);
                              if (cVar2 != '\0') {
                                QPersistentModelIndex::operator_cast_to_QModelIndex
                                          ((QModelIndex *)&local_c0,&parentIdx);
                                local_a0._forAlignment = -NAN;
                                local_a0._8_8_ = 0;
                                local_a0._16_8_ = 0;
                                bVar1 = (bool)GenericModel::moveRows
                                                        ((QModelIndex *)&baseModel,(int)&local_c0,0,
                                                         (QModelIndex *)0x1,(int)&local_a0);
                                cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.moveRows(parentIdx, 0, 1, QModelIndex(), 5)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xca);
                                if (cVar2 != '\0') {
                                  QPersistentModelIndex::operator_cast_to_QModelIndex
                                            (&local_80,&proxyParentIdx);
                                  QIdentityProxyModel::index
                                            ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x0);
                                  QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,
                                                    0x100);
                                  iVar3 = QVariant::toInt((bool *)local_c0.data);
                                  cVar2 = QTest::qCompare(iVar3,0x7d2,
                                                                                                                    
                                                  "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xcb);
                                  QVariant::~QVariant((QVariant *)&local_c0);
                                  if (cVar2 != '\0') {
                                    QPersistentModelIndex::operator_cast_to_QModelIndex
                                              (&local_80,&proxyParentIdx);
                                    QIdentityProxyModel::index
                                              ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x1);
                                    QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0
                                                      ,0x100);
                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                    cVar2 = QTest::qCompare(iVar3,0x7d3,
                                                                                                                        
                                                  "proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xcc);
                                    QVariant::~QVariant((QVariant *)&local_c0);
                                    if (cVar2 != '\0') {
                                      QPersistentModelIndex::operator_cast_to_QModelIndex
                                                (&local_80,&proxyParentIdx);
                                      QIdentityProxyModel::index
                                                ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x2)
                                      ;
                                      QModelIndex::data((QVariant *)&local_c0,
                                                        (QModelIndex *)&local_a0,0x100);
                                      iVar3 = QVariant::toInt((bool *)local_c0.data);
                                      cVar2 = QTest::qCompare(iVar3,0x7d4,
                                                                                                                            
                                                  "proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xcd);
                                      QVariant::~QVariant((QVariant *)&local_c0);
                                      if (cVar2 != '\0') {
                                        QPersistentModelIndex::operator_cast_to_QModelIndex
                                                  (&local_80,&proxyParentIdx);
                                        QIdentityProxyModel::index
                                                  ((int)&local_a0,(int)&proxyModel,
                                                   (QModelIndex *)0x3);
                                        QModelIndex::data((QVariant *)&local_c0,
                                                          (QModelIndex *)&local_a0,0x100);
                                        iVar3 = QVariant::toInt((bool *)local_c0.data);
                                        cVar2 = QTest::qCompare(iVar3,2000,
                                                                                                                                
                                                  "proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xce);
                                        QVariant::~QVariant((QVariant *)&local_c0);
                                        if (cVar2 != '\0') {
                                          local_80.r = -1;
                                          local_80.c = -1;
                                          local_80.i = 0;
                                          local_80.m = (QAbstractItemModel *)0x0;
                                          QIdentityProxyModel::index
                                                    ((int)&local_a0,(int)&proxyModel,
                                                     (QModelIndex *)0x0);
                                          QModelIndex::data((QVariant *)&local_c0,
                                                            (QModelIndex *)&local_a0,0x100);
                                          iVar3 = QVariant::toInt((bool *)local_c0.data);
                                          cVar2 = QTest::qCompare(iVar3,0x3e9,
                                                                                                                                    
                                                  "proxyModel.index(0, 0).data(Qt::UserRole).toInt()"
                                                  ,"1001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xcf);
                                          QVariant::~QVariant((QVariant *)&local_c0);
                                          if (cVar2 != '\0') {
                                            local_80.r = -1;
                                            local_80.c = -1;
                                            local_80.i = 0;
                                            local_80.m = (QAbstractItemModel *)0x0;
                                            QIdentityProxyModel::index
                                                      ((int)&local_a0,(int)&proxyModel,
                                                       (QModelIndex *)0x1);
                                            QModelIndex::data((QVariant *)&local_c0,
                                                              (QModelIndex *)&local_a0,0x100);
                                            iVar3 = QVariant::toInt((bool *)local_c0.data);
                                            cVar2 = QTest::qCompare(iVar3,0x3ea,
                                                                                                                                        
                                                  "proxyModel.index(1, 0).data(Qt::UserRole).toInt()"
                                                  ,"1002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xd0);
                                            QVariant::~QVariant((QVariant *)&local_c0);
                                            if (cVar2 != '\0') {
                                              local_80.r = -1;
                                              local_80.c = -1;
                                              local_80.i = 0;
                                              local_80.m = (QAbstractItemModel *)0x0;
                                              QIdentityProxyModel::index
                                                        ((int)&local_a0,(int)&proxyModel,
                                                         (QModelIndex *)0x2);
                                              QModelIndex::data((QVariant *)&local_c0,
                                                                (QModelIndex *)&local_a0,0x100);
                                              iVar3 = QVariant::toInt((bool *)local_c0.data);
                                              cVar2 = QTest::qCompare(iVar3,0x3eb,
                                                                                                                                            
                                                  "proxyModel.index(2, 0).data(Qt::UserRole).toInt()"
                                                  ,"1003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xd1);
                                              QVariant::~QVariant((QVariant *)&local_c0);
                                              if (cVar2 != '\0') {
                                                local_80.r = -1;
                                                local_80.c = -1;
                                                local_80.i = 0;
                                                local_80.m = (QAbstractItemModel *)0x0;
                                                QIdentityProxyModel::index
                                                          ((int)&local_a0,(int)&proxyModel,
                                                           (QModelIndex *)0x3);
                                                QModelIndex::data((QVariant *)&local_c0,
                                                                  (QModelIndex *)&local_a0,0x100);
                                                iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                cVar2 = QTest::qCompare(iVar3,0x3ec,
                                                                                                                                                
                                                  "proxyModel.index(3, 0).data(Qt::UserRole).toInt()"
                                                  ,"1004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xd2);
                                                QVariant::~QVariant((QVariant *)&local_c0);
                                                if (cVar2 != '\0') {
                                                  local_80.r = -1;
                                                  local_80.c = -1;
                                                  local_80.i = 0;
                                                  local_80.m = (QAbstractItemModel *)0x0;
                                                  QIdentityProxyModel::index
                                                            ((int)&local_a0,(int)&proxyModel,
                                                             (QModelIndex *)0x4);
                                                  QModelIndex::data((QVariant *)&local_c0,
                                                                    (QModelIndex *)&local_a0,0x100);
                                                  iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                  cVar2 = QTest::qCompare(iVar3,1000,
                                                                                                                                                    
                                                  "proxyModel.index(4, 0).data(Qt::UserRole).toInt()"
                                                  ,"1000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xd3);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x5);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x7d1,
                                                                                                                                                        
                                                  "proxyModel.index(5, 0).data(Qt::UserRole).toInt()"
                                                  ,"2001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xd4);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    local_c0._forAlignment = -NAN;
                                                    local_c0._8_8_ = 0;
                                                    local_c0._16_8_ = 0;
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              ((QModelIndex *)&local_a0,&parentIdx);
                                                    bVar1 = (bool)GenericModel::moveRows
                                                                            ((QModelIndex *)
                                                                             &baseModel,
                                                                             (int)&local_c0,1,
                                                                             (QModelIndex *)0x1,
                                                                             (int)&local_a0);
                                                    cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.moveRows(QModelIndex(), 1, 1, parentIdx, 4)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xd5);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x3e9,
                                                                                                                                                        
                                                  "proxyModel.index(0, 0).data(Qt::UserRole).toInt()"
                                                  ,"1001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xd6);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x1);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x3eb,
                                                                                                                                                        
                                                  "proxyModel.index(1, 0).data(Qt::UserRole).toInt()"
                                                  ,"1003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xd7);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x2);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x3ec,
                                                                                                                                                        
                                                  "proxyModel.index(2, 0).data(Qt::UserRole).toInt()"
                                                  ,"1004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xd8);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x3);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,1000,
                                                                                                                                                        
                                                  "proxyModel.index(3, 0).data(Qt::UserRole).toInt()"
                                                  ,"1000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xd9);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x4);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x7d1,
                                                                                                                                                        
                                                  "proxyModel.index(4, 0).data(Qt::UserRole).toInt()"
                                                  ,"2001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xda);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_80,&proxyParentIdx);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x7d2,
                                                                                                                                                        
                                                  "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xdb);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_80,&proxyParentIdx);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x1);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x7d3,
                                                                                                                                                        
                                                  "proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xdc);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_80,&proxyParentIdx);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x2);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x7d4,
                                                                                                                                                        
                                                  "proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xdd);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_80,&proxyParentIdx);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x3);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,2000,
                                                                                                                                                        
                                                  "proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xde);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_80,&proxyParentIdx);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x4);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    QTest::qCompare(iVar3,0x3ea,
                                                                                                                                        
                                                  "proxyModel.index(4, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"1002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0xdf);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
LAB_0010c12a:
  QPersistentModelIndex::~QPersistentModelIndex(&proxyParentIdx);
  RoleMaskProxyModel::~RoleMaskProxyModel(&proxyModel);
  QPersistentModelIndex::~QPersistentModelIndex(&parentIdx);
  GenericModel::~GenericModel(&baseModel);
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testMoveRowAfter()
{
#ifdef QTMODELUTILITIES_GENERICMODEL
    const auto fillData = [](QAbstractItemModel *model, const QModelIndex &parent = QModelIndex(), int shift = 0) {
        for (int i = 0, maxI = model->rowCount(parent); i < maxI; ++i) {
            for (int j = 0, maxJ = model->columnCount(parent); j < maxJ; ++j) {
                model->setData(model->index(i, j, parent), i + shift, Qt::UserRole);
                model->setData(model->index(i, j, parent), j + shift, Qt::UserRole + 1);
            }
        }
    };
    GenericModel baseModel;
    baseModel.insertColumns(0, 2);
    baseModel.insertRows(0, 5);
    fillData(&baseModel);
    const QPersistentModelIndex parentIdx = baseModel.index(1, 0);
    baseModel.insertColumns(0, 2, parentIdx);
    baseModel.insertRows(0, 5, parentIdx);
    fillData(&baseModel, parentIdx, 50);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, &baseModel);
    proxyModel.addMaskedRole(Qt::UserRole);
    proxyModel.setSourceModel(&baseModel);
    const QPersistentModelIndex proxyParentIdx = proxyModel.mapFromSource(parentIdx);
    for (int i = 0; i < proxyModel.rowCount(); ++i)
        QVERIFY(proxyModel.setData(proxyModel.index(i, 0), 1000 + i, Qt::UserRole));
    for (int i = 0; i < proxyModel.rowCount(proxyParentIdx); ++i)
        QVERIFY(proxyModel.setData(proxyModel.index(i, 0, proxyParentIdx), 2000 + i, Qt::UserRole));
    QVERIFY(baseModel.moveRows(QModelIndex(), 0, 1, QModelIndex(), 5));
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(1, 0).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(2, 0).data(Qt::UserRole).toInt(), 1003);
    QCOMPARE(proxyModel.index(3, 0).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(4, 0).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyParentIdx.data(Qt::UserRole).toInt(), 1001);
    QVERIFY(baseModel.moveRows(parentIdx, 0, 1, parentIdx, 5));
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
    QCOMPARE(proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(4, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QVERIFY(baseModel.moveRows(parentIdx, 0, 1, QModelIndex(), 5));
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
    QCOMPARE(proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(1, 0).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(2, 0).data(Qt::UserRole).toInt(), 1003);
    QCOMPARE(proxyModel.index(3, 0).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(4, 0).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(5, 0).data(Qt::UserRole).toInt(), 2001);
    QVERIFY(baseModel.moveRows(QModelIndex(), 1, 1, parentIdx, 4));
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(1, 0).data(Qt::UserRole).toInt(), 1003);
    QCOMPARE(proxyModel.index(2, 0).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(3, 0).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(4, 0).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
    QCOMPARE(proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(4, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 1002);
#else
    QSKIP("This test requires the GenericModel module");
#endif
}